

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_get_execution_modes(spvc_compiler compiler,SpvExecutionMode **modes,size_t *num_modes)

{
  undefined4 uVar1;
  size_t sVar2;
  spvc_context psVar3;
  char *pcVar4;
  uint *puVar5;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var6;
  Bitset *pBVar7;
  long lVar8;
  _Hash_node_base *p_Var9;
  long lVar10;
  uint32_t i;
  ulong uVar11;
  long lVar12;
  SmallVector<unsigned_int,_8UL> local_98;
  spvc_compiler local_60;
  SpvExecutionMode **local_58;
  
  _Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0x40);
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined ***)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_003a2b38;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 **)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  local_58 = modes;
  pBVar7 = spirv_cross::Compiler::get_execution_mode_bitset
                     ((compiler->compiler)._M_t.
                      super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                      .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
  uVar11 = 0;
  do {
    if ((pBVar7->lower >> (uVar11 & 0x3f) & 1) != 0) {
      spirv_cross::SmallVector<SpvExecutionMode_,_8UL>::reserve
                ((SmallVector<SpvExecutionMode_,_8UL> *)
                 ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                 8),*(long *)((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                    _M_head_impl + 0x10) + 1);
      lVar8 = *(long *)((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                              _M_head_impl + 0x10);
      *(int *)(*(long *)((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                               _M_head_impl + 8) + lVar8 * 4) = (int)uVar11;
      *(long *)((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
               0x10) = lVar8 + 1;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x40);
  sVar2 = (pBVar7->higher)._M_h._M_element_count;
  if (sVar2 != 0) {
    local_98.super_VectorView<unsigned_int>.ptr = (uint *)&local_98.stack_storage;
    local_98.super_VectorView<unsigned_int>.buffer_size = 0;
    local_98.buffer_capacity = 8;
    spirv_cross::SmallVector<unsigned_int,_8UL>::reserve(&local_98,sVar2);
    p_Var9 = (pBVar7->higher)._M_h._M_before_begin._M_nxt;
    if (p_Var9 != (_Hash_node_base *)0x0) {
      do {
        spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
                  (&local_98,local_98.super_VectorView<unsigned_int>.buffer_size + 1);
        *(undefined4 *)
         ((char *)local_98.super_VectorView<unsigned_int>.ptr +
         local_98.super_VectorView<unsigned_int>.buffer_size * 4) = *(undefined4 *)&p_Var9[1]._M_nxt
        ;
        local_98.super_VectorView<unsigned_int>.buffer_size =
             local_98.super_VectorView<unsigned_int>.buffer_size + 1;
        p_Var9 = p_Var9->_M_nxt;
      } while (p_Var9 != (_Hash_node_base *)0x0);
    }
    puVar5 = local_98.super_VectorView<unsigned_int>.ptr;
    if (local_98.super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar10 = local_98.super_VectorView<unsigned_int>.buffer_size * 4;
      pcVar4 = (char *)local_98.super_VectorView<unsigned_int>.ptr;
      lVar8 = 0x3f;
      if (local_98.super_VectorView<unsigned_int>.buffer_size != 0) {
        for (; local_98.super_VectorView<unsigned_int>.buffer_size >> lVar8 == 0; lVar8 = lVar8 + -1
            ) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_98.super_VectorView<unsigned_int>.ptr,pcVar4 + lVar10,
                 ((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar5,pcVar4 + lVar10);
      puVar5 = local_98.super_VectorView<unsigned_int>.ptr;
      if (local_98.super_VectorView<unsigned_int>.buffer_size != 0) {
        lVar8 = *(long *)((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                _M_head_impl + 0x10);
        lVar12 = local_98.super_VectorView<unsigned_int>.buffer_size << 2;
        lVar10 = 0;
        local_60 = compiler;
        do {
          uVar1 = *(undefined4 *)((char *)puVar5 + lVar10);
          spirv_cross::SmallVector<SpvExecutionMode_,_8UL>::reserve
                    ((SmallVector<SpvExecutionMode_,_8UL> *)
                     ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                            _M_head_impl + 8),lVar8 + 1);
          lVar8 = *(long *)((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                  _M_head_impl + 0x10);
          *(undefined4 *)
           (*(long *)((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                            _M_head_impl + 8) + lVar8 * 4) = uVar1;
          lVar8 = lVar8 + 1;
          *(long *)((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl
                   + 0x10) = lVar8;
          lVar10 = lVar10 + 4;
          compiler = local_60;
        } while (lVar12 != lVar10);
      }
    }
    local_98.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_98.super_VectorView<unsigned_int>.ptr !=
        &local_98.stack_storage) {
      free(local_98.super_VectorView<unsigned_int>.ptr);
    }
  }
  *local_58 = *(SpvExecutionMode **)
               ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8
               );
  *num_modes = *(size_t *)
                ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                0x10);
  psVar3 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar3->allocations,
            (psVar3->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar2 = (psVar3->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar3->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar2]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar3->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar2 + 1;
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_execution_modes(spvc_compiler compiler, const SpvExecutionMode **modes, size_t *num_modes)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto ptr = spvc_allocate<TemporaryBuffer<SpvExecutionMode>>();

		compiler->compiler->get_execution_mode_bitset().for_each_bit(
		    [&](uint32_t bit) { ptr->buffer.push_back(static_cast<SpvExecutionMode>(bit)); });

		*modes = ptr->buffer.data();
		*num_modes = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}